

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::Null(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
       *this,Context *context)

{
  bool bVar1;
  ValueType *pVVar2;
  Ch *pCVar3;
  
  if ((this->type_ & 1) == 0) {
    pVVar2 = switchD_0014a871::default();
    DisallowedType(this,context,pVVar2);
    context->invalidCode = kValidateErrorType;
    pVVar2 = GetTypeString();
    pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar2);
    context->invalidKeyword = pCVar3;
    return false;
  }
  bVar1 = CreateParallelValidator(this,context);
  return bVar1;
}

Assistant:

bool Null(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::Null");
        if (!(type_ & (1 << kNullSchemaType))) {
            DisallowedType(context, GetNullString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }
        return CreateParallelValidator(context);
    }